

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O1

CURLcode Curl_auth_decode_ntlm_type2_message(Curl_easy *data,bufref *type2ref,ntlmdata *ntlm)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  long *plVar4;
  size_t sVar5;
  uchar *puVar6;
  void *__dest;
  CURLcode CVar7;
  
  plVar4 = (long *)Curl_bufref_ptr(type2ref);
  sVar5 = Curl_bufref_len(type2ref);
  ntlm->flags = 0;
  CVar7 = CURLE_BAD_CONTENT_ENCODING;
  if (((sVar5 < 0x20) || (*plVar4 != 0x5053534d4c544e)) || ((int)plVar4[1] != 2)) {
LAB_00150bba:
    Curl_infof(data,"NTLM handshake failure (bad type-2 message)");
  }
  else {
    uVar3 = Curl_read32_le((uchar *)((long)plVar4 + 0x14));
    ntlm->flags = uVar3;
    *(long *)ntlm->nonce = plVar4[3];
    if ((uVar3 >> 0x17 & 1) != 0) {
      puVar6 = Curl_bufref_ptr(type2ref);
      sVar5 = Curl_bufref_len(type2ref);
      CVar7 = CURLE_OK;
      uVar2 = 0;
      if (sVar5 < 0x30) {
LAB_00150cb6:
        ntlm->target_info_len = (uint)uVar2;
        bVar1 = true;
      }
      else {
        uVar2 = Curl_read16_le(puVar6 + 0x28);
        uVar3 = Curl_read32_le(puVar6 + 0x2c);
        if (uVar2 == 0) goto LAB_00150cb6;
        if (sVar5 < uVar3) {
LAB_00150c63:
          bVar1 = false;
          Curl_infof(data,
                     "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer"
                    );
          CVar7 = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          if (uVar3 < 0x30 || sVar5 < uVar2 + uVar3) goto LAB_00150c63;
          (*Curl_cfree)(ntlm->target_info);
          __dest = (*Curl_cmalloc)((ulong)uVar2);
          ntlm->target_info = __dest;
          if (__dest != (void *)0x0) {
            memcpy(__dest,puVar6 + uVar3,(ulong)uVar2);
            goto LAB_00150cb6;
          }
          CVar7 = CURLE_OUT_OF_MEMORY;
          bVar1 = false;
        }
      }
      if (!bVar1) goto LAB_00150bba;
    }
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_auth_decode_ntlm_type2_message(struct Curl_easy *data,
                                             const struct bufref *type2ref,
                                             struct ntlmdata *ntlm)
{
  static const char type2_marker[] = { 0x02, 0x00, 0x00, 0x00 };

  /* NTLM type-2 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x02000000)
           12    Target Name            security buffer
           20    Flags                  long
           24    Challenge              8 bytes
          (32)   Context                8 bytes (two consecutive longs) (*)
          (40)   Target Information     security buffer (*)
          (48)   OS Version Structure   8 bytes (*)
  32 (48) (56)   Start of data block    (*)
                                        (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  const unsigned char *type2 = Curl_bufref_ptr(type2ref);
  size_t type2len = Curl_bufref_len(type2ref);

#if defined(NTLM_NEEDS_NSS_INIT)
  /* Make sure the crypto backend is initialized */
  result = Curl_nss_force_init(data);
  if(result)
    return result;
#elif defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)data;
#endif

  ntlm->flags = 0;

  if((type2len < 32) ||
     (memcmp(type2, NTLMSSP_SIGNATURE, 8) != 0) ||
     (memcmp(type2 + 8, type2_marker, sizeof(type2_marker)) != 0)) {
    /* This was not a good enough type-2 message */
    infof(data, "NTLM handshake failure (bad type-2 message)");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = Curl_read32_le(&type2[20]);
  memcpy(ntlm->nonce, &type2[24], 8);

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_TARGET_INFO) {
    result = ntlm_decode_type2_target(data, type2ref, ntlm);
    if(result) {
      infof(data, "NTLM handshake failure (bad type-2 message)");
      return result;
    }
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE2 header flags=0x%08.8lx ", ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n                  nonce=");
    ntlm_print_hex(stderr, (char *)ntlm->nonce, 8);
    fprintf(stderr, "\n****\n");
    fprintf(stderr, "**** Header %s\n ", header);
  });

  return result;
}